

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O1

char * google::protobuf::internal::TcParser::FastZ32R2
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  ulong uVar4;
  ParseContext *extraout_RDX;
  ParseContext *ctx_00;
  char *pcVar5;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar6;
  RepeatedField<int> *this;
  uint *puVar7;
  
  if (data.field_0._0_2_ != 0) {
    pcVar5 = MiniParse(msg,ptr,ctx,data,table,hasbits);
    return pcVar5;
  }
  this = (RepeatedField<int> *)((long)&msg->_vptr_MessageLite + ((ulong)data.field_0 >> 0x30));
  if (((ulong)this & 7) != 0) {
    AlignFail(this);
  }
  uVar1 = *(ushort *)ptr;
  ctx_00 = ctx;
  do {
    pcVar5 = (char *)(long)*(char *)((long)&(((ParseContext *)ptr)->super_EpsCopyInputStream).
                                            limit_end_ + 2);
    if ((long)pcVar5 < 0) {
      data.field_0.data = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0xffffffffffffff80;
      aVar6.data = (long)*(char *)((long)&(((ParseContext *)ptr)->super_EpsCopyInputStream).
                                          limit_end_ + 3) << 7 | 0x7f;
      if ((long)aVar6 < 0) {
        data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                       ((long)*(char *)((long)&(((ParseContext *)ptr)->super_EpsCopyInputStream).
                                               limit_end_ + 4) << 0xe | 0x3fff);
        if ((long)data.field_0 < 0) {
          aVar6.data = ((long)*(char *)((long)&(((ParseContext *)ptr)->super_EpsCopyInputStream).
                                               limit_end_ + 5) << 0x15 | 0x1fffffU) & aVar6.data;
          if ((long)aVar6 < 0) {
            data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                           (((long)*(char *)((long)&(((ParseContext *)ptr)->super_EpsCopyInputStream
                                                    ).limit_end_ + 6) << 0x1c | 0xfffffffU) &
                           (ulong)data.field_0);
            if ((long)data.field_0 < 0) {
              if (*(char *)((long)&(((ParseContext *)ptr)->super_EpsCopyInputStream).limit_end_ + 7)
                  < '\0') {
                if (*(char *)&(((ParseContext *)ptr)->super_EpsCopyInputStream).buffer_end_ < '\0')
                {
                  if (*(char *)((long)&(((ParseContext *)ptr)->super_EpsCopyInputStream).buffer_end_
                               + 1) < '\0') {
                    if (*(char *)((long)&(((ParseContext *)ptr)->super_EpsCopyInputStream).
                                         buffer_end_ + 2) < '\0') {
                      ctx_00 = (ParseContext *)
                               ((long)&(((ParseContext *)ptr)->super_EpsCopyInputStream).buffer_end_
                               + 4);
                      if ((*(char *)((long)&(((ParseContext *)ptr)->super_EpsCopyInputStream).
                                            buffer_end_ + 3) != '\x01') &&
                         (*(char *)((long)&(((ParseContext *)ptr)->super_EpsCopyInputStream).
                                           buffer_end_ + 3) < '\0')) {
                        ptr = (char *)0x0;
                        goto LAB_004472c3;
                      }
                    }
                    else {
                      ctx_00 = (ParseContext *)
                               ((long)&(((ParseContext *)ptr)->super_EpsCopyInputStream).buffer_end_
                               + 3);
                    }
                  }
                  else {
                    ctx_00 = (ParseContext *)
                             ((long)&(((ParseContext *)ptr)->super_EpsCopyInputStream).buffer_end_ +
                             2);
                  }
                }
                else {
                  ctx_00 = (ParseContext *)
                           ((long)&(((ParseContext *)ptr)->super_EpsCopyInputStream).buffer_end_ + 1
                           );
                }
              }
              else {
                ctx_00 = (ParseContext *)
                         &(((ParseContext *)ptr)->super_EpsCopyInputStream).buffer_end_;
              }
            }
            else {
              ctx_00 = (ParseContext *)
                       ((long)&(((ParseContext *)ptr)->super_EpsCopyInputStream).limit_end_ + 7);
            }
          }
          else {
            ctx_00 = (ParseContext *)
                     ((long)&(((ParseContext *)ptr)->super_EpsCopyInputStream).limit_end_ + 6);
          }
        }
        else {
          ctx_00 = (ParseContext *)
                   ((long)&(((ParseContext *)ptr)->super_EpsCopyInputStream).limit_end_ + 5);
        }
        data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)((ulong)data.field_0 & aVar6.data)
        ;
        ptr = (char *)ctx_00;
        aVar6.data = (uint64_t)data.field_0;
      }
      else {
        ptr = (char *)((long)&(((ParseContext *)ptr)->super_EpsCopyInputStream).limit_end_ + 4);
      }
      pcVar5 = (char *)((ulong)pcVar5 & aVar6.data);
    }
    else {
      ptr = (char *)((long)&(((ParseContext *)ptr)->super_EpsCopyInputStream).limit_end_ + 3);
    }
LAB_004472c3:
    if ((ParseContext *)ptr == (ParseContext *)0x0) {
      pcVar5 = Error(msg,pcVar5,ctx_00,data,table,hasbits);
      return pcVar5;
    }
    RepeatedField<int>::Add(this,-((uint)pcVar5 & 1) ^ (uint)((ulong)pcVar5 >> 1) & 0x7fffffff);
    if ((ParseContext *)(ctx->super_EpsCopyInputStream).limit_end_ <= ptr) {
      if ((ulong)table->has_bits_offset != 0) {
        puVar7 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
        if (((ulong)puVar7 & 3) != 0) {
          AlignFail(puVar7);
        }
        *puVar7 = *puVar7 | (uint)hasbits;
      }
      return (char *)(ParseContext *)ptr;
    }
    uVar2 = *(ushort *)&(((ParseContext *)ptr)->super_EpsCopyInputStream).limit_end_;
    data.field_0.data._2_6_ = 0;
    data.field_0.data._0_2_ = uVar2;
    ctx_00 = extraout_RDX;
    if (uVar2 != uVar1) {
      uVar3 = (uint)table->fast_idx_mask & (uint)uVar2;
      if ((uVar3 & 7) != 0) {
        protobuf_assumption_failed
                  ("(idx & 7) == 0",
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                   ,0x452);
      }
      uVar4 = (ulong)(uVar3 & 0xfffffff8);
      pcVar5 = (char *)(**(code **)(&table[1].has_bits_offset + uVar4))
                                 (msg,ptr,ctx,
                                  (ulong)data.field_0 ^
                                  *(ulong *)(&table[1].fast_idx_mask + uVar4 * 2),table,hasbits);
      return pcVar5;
    }
  } while( true );
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastZ32R2(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return RepeatedVarint<int32_t, uint16_t, true>(
      PROTOBUF_TC_PARAM_PASS);
}